

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _d,int _c,size_t _elemsize,Allocator *_allocator)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 extraout_var;
  void *pvVar9;
  undefined1 auVar10 [16];
  void *ptr;
  void *local_38;
  
  uVar1 = this->dims;
  uVar2 = this->w;
  uVar3 = this->h;
  uVar4 = this->d;
  auVar10._0_4_ = -(uint)(uVar1 == 4);
  auVar10._4_4_ = -(uint)(_w == uVar2);
  auVar10._8_4_ = -(uint)(_h == uVar3);
  auVar10._12_4_ = -(uint)(_d == uVar4);
  iVar6 = movmskps(4,auVar10);
  if ((((iVar6 != 0xf) || (this->c != _c)) || (this->elempack != 1)) ||
     ((this->allocator != _allocator || (this->elemsize != _elemsize)))) {
    piVar5 = this->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(this->data);
          }
        }
        else {
          (*this->allocator->_vptr_Allocator[3])();
        }
      }
    }
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 4;
    this->w = _w;
    this->h = _h;
    this->d = _d;
    this->c = _c;
    uVar7 = (long)_d * _elemsize * (long)_h * (long)_w + 0xf & 0xfffffffffffffff0;
    uVar8 = uVar7 / _elemsize;
    this->cstep = uVar8;
    uVar8 = (long)_c * _elemsize * uVar8 + 3 & 0xfffffffffffffffc;
    if (uVar8 != 0) {
      if (_allocator == (Allocator *)0x0) {
        local_38 = (void *)0x0;
        iVar6 = posix_memalign(&local_38,0x40,uVar8 + 0x44);
        pvVar9 = (void *)0x0;
        if (iVar6 == 0) {
          pvVar9 = local_38;
        }
      }
      else {
        iVar6 = (*_allocator->_vptr_Allocator[2])(_allocator,uVar8 + 4,uVar7 % _elemsize);
        pvVar9 = (void *)CONCAT44(extraout_var,iVar6);
      }
      this->data = pvVar9;
      if (pvVar9 != (void *)0x0) {
        this->refcount = (int *)((long)pvVar9 + uVar8);
        *(undefined4 *)((long)pvVar9 + uVar8) = 1;
      }
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _d, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 4 && w == _w && h == _h && d == _d && c == _c && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 4;
    w = _w;
    h = _h;
    d = _d;
    c = _c;

    cstep = alignSize((size_t)w * h * d * elemsize, 16) / elemsize;

    size_t totalsize = alignSize(total() * elemsize, 4);
    if (totalsize > 0)
    {
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
    }

    if (data)
    {
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}